

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::endWhen
          (HumanResults *this,Stats *stats,NameStack *context,string *given,NameStack *whenStack,
          string *when)

{
  WrittenState WVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->whenDepth_ - 1;
  this->whenDepth_ = uVar2;
  uVar3 = this->whenWrittenDepth_;
  if (uVar2 <= this->whenWrittenDepth_) {
    uVar3 = uVar2;
  }
  this->whenWrittenDepth_ = uVar3;
  if ((uVar2 == 0) && (5 < (int)this->verbosity_)) {
    ::std::__ostream_insert<char,std::char_traits<char>>((this->output_).value,"\n",1);
  }
  if (this->whenDepth_ == 0) {
    WVar1 = CONTEXT;
    if ((int)this->writtenState_ < 2) {
      return;
    }
  }
  else {
    WVar1 = GIVEN;
    if ((int)this->writtenState_ < 3) {
      return;
    }
  }
  this->writtenState_ = WVar1;
  return;
}

Assistant:

virtual void endWhen(const Stats& stats,
                             const NameStack& context,
                             const string& given,
                             const NameStack& whenStack,
                             const string& when) override {
            --whenDepth_;
            whenWrittenDepth_ = min(whenDepth_, whenWrittenDepth_);

            if (whenDepth_ == 0 && verbosity_ >= Verbosity::CHECKS) {
                *output_ << "\n";
            }

            if (whenDepth_ == 0) {
                setMaxWrittenState(WrittenState::CONTEXT);
            }
            else {
                setMaxWrittenState(WrittenState::GIVEN);
            }
        }